

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O0

void flatbuffers::anon_unknown_7::GenerateDocumentation
               (ostream *os,BinaryRegion *region,BinarySection *section,uint8_t *binary,
               DocContinuation *continuation,OutputConfig *output_config)

{
  size_t sVar1;
  string *psVar2;
  BinaryRegion *pBVar3;
  ostream *poVar4;
  size_t *psVar5;
  size_t *__a;
  BinarySection *pBVar6;
  BinaryRegion *region_00;
  string local_6b8;
  string local_698 [32];
  string local_678;
  int local_654;
  stringstream local_650 [8];
  stringstream ss_2;
  ostream local_640 [376];
  unsigned_long local_4c8;
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [36];
  int local_45c;
  stringstream local_458 [8];
  stringstream ss_1;
  ostream local_448 [376];
  undefined1 local_2d0 [8];
  string value;
  string local_290 [32];
  string local_270;
  int local_24c;
  stringstream local_248 [8];
  stringstream ss;
  ostream local_238 [376];
  long local_c0;
  size_t size_of;
  string local_b0 [32];
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [32];
  BinarySection *local_38;
  OutputConfig *output_config_local;
  DocContinuation *continuation_local;
  uint8_t *binary_local;
  BinarySection *section_local;
  BinaryRegion *region_local;
  ostream *os_local;
  
  local_38 = (BinarySection *)output_config;
  output_config_local = (OutputConfig *)continuation;
  continuation_local = (DocContinuation *)binary;
  binary_local = (uint8_t *)section;
  section_local = (BinarySection *)region;
  region_local = (BinaryRegion *)os;
  if (continuation->value_start_column == 0) {
    local_c0 = 0;
    std::__cxx11::stringstream::stringstream(local_248);
    local_24c = (int)std::setw(*(int *)&local_38->name);
    poVar4 = std::operator<<(local_238,(_Setw)local_24c);
    std::ostream::operator<<(poVar4,std::left);
    (anonymous_namespace)::GenerateTypeString_abi_cxx11_
              (&local_270,(_anonymous_namespace_ *)section_local,region_00);
    std::operator<<(local_238,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    pBVar3 = region_local;
    std::__cxx11::stringstream::str();
    std::operator<<((ostream *)pBVar3,local_290);
    std::__cxx11::string::~string(local_290);
    std::__cxx11::stringstream::str();
    local_c0 = std::__cxx11::string::size();
    std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
    std::__cxx11::stringstream::~stringstream(local_248);
    poVar4 = std::operator<<((ostream *)region_local," ");
    poVar4 = std::operator<<(poVar4,(char)local_38->type);
    std::operator<<(poVar4," ");
    if (*(long *)((long)&(section_local->name).field_2 + 8) == 0) {
      std::__cxx11::stringstream::stringstream(local_650);
      local_654 = (int)std::setw((int)(local_38->name)._M_string_length);
      poVar4 = std::operator<<(local_640,(_Setw)local_654);
      std::ostream::operator<<(poVar4,std::left);
      pBVar6 = local_38;
      (anonymous_namespace)::ToValueString_abi_cxx11_
                (&local_678,(_anonymous_namespace_ *)section_local,
                 (BinaryRegion *)continuation_local,(uint8_t *)local_38,(OutputConfig *)continuation
                );
      std::operator<<(local_640,(string *)&local_678);
      std::__cxx11::string::~string((string *)&local_678);
      pBVar3 = region_local;
      std::__cxx11::stringstream::str();
      std::operator<<((ostream *)pBVar3,local_698);
      std::__cxx11::string::~string(local_698);
      std::__cxx11::stringstream::~stringstream(local_650);
    }
    else {
      output_config_local->largest_type_string = local_c0 + 3;
      (anonymous_namespace)::ToValueString_abi_cxx11_
                ((string *)local_2d0,(_anonymous_namespace_ *)section_local,
                 (BinaryRegion *)continuation_local,(uint8_t *)local_38,(OutputConfig *)continuation
                );
      std::__cxx11::stringstream::stringstream(local_458);
      local_45c = (int)std::setw((int)(local_38->name)._M_string_length);
      poVar4 = std::operator<<(local_448,(_Setw)local_45c);
      std::ostream::operator<<(poVar4,std::left);
      std::__cxx11::string::substr((ulong)local_480,(ulong)local_2d0);
      std::operator<<(local_448,local_480);
      std::__cxx11::string::~string(local_480);
      pBVar3 = region_local;
      std::__cxx11::stringstream::str();
      std::operator<<((ostream *)pBVar3,local_4a0);
      std::__cxx11::string::~string(local_4a0);
      psVar2 = &local_38->name;
      local_4c8 = std::__cxx11::string::size();
      std::min<unsigned_long>(&(psVar2->field_2)._M_allocated_capacity,&local_4c8);
      pBVar6 = (BinarySection *)0xffffffffffffffff;
      std::__cxx11::string::substr((ulong)local_4c0,(ulong)local_2d0);
      std::__cxx11::string::operator=
                ((string *)&output_config_local->largest_value_string,local_4c0);
      std::__cxx11::string::~string(local_4c0);
      std::__cxx11::stringstream::~stringstream(local_458);
      std::__cxx11::string::~string((string *)local_2d0);
    }
    poVar4 = std::operator<<((ostream *)region_local," ");
    poVar4 = std::operator<<(poVar4,(char)local_38->type);
    std::operator<<(poVar4," ");
    pBVar3 = region_local;
    (anonymous_namespace)::GenerateComment_abi_cxx11_
              (&local_6b8,(_anonymous_namespace_ *)&section_local->regions,
               (BinaryRegionComment *)binary_local,pBVar6);
    std::operator<<((ostream *)pBVar3,(string *)&local_6b8);
    std::__cxx11::string::~string((string *)&local_6b8);
  }
  else {
    sVar1 = continuation->value_start_column;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_58,sVar1 - 2,' ',&local_59);
    std::operator<<(os,local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
    poVar4 = std::operator<<((ostream *)region_local,*(char *)&local_38->type);
    std::operator<<(poVar4," ");
    pBVar3 = region_local;
    std::__cxx11::string::substr((ulong)local_90,(ulong)&output_config_local->largest_value_string);
    std::operator<<((ostream *)pBVar3,local_90);
    std::__cxx11::string::~string(local_90);
    psVar5 = &output_config_local->largest_value_string;
    __a = (size_t *)((long)local_38 + 0x10);
    size_of = std::__cxx11::string::size();
    std::min<unsigned_long>(__a,&size_of);
    std::__cxx11::string::substr((ulong)local_b0,(ulong)psVar5);
    std::__cxx11::string::operator=((string *)&output_config_local->largest_value_string,local_b0);
    std::__cxx11::string::~string(local_b0);
  }
  return;
}

Assistant:

static void GenerateDocumentation(std::ostream &os, const BinaryRegion &region,
                                  const BinarySection &section,
                                  const uint8_t *binary,
                                  DocContinuation &continuation,
                                  const OutputConfig &output_config) {
  // Check if there is a doc continuation that should be prioritized.
  if (continuation.value_start_column) {
    os << std::string(continuation.value_start_column - 2, ' ');
    os << output_config.delimiter << " ";

    os << continuation.value.substr(0, output_config.max_bytes_per_line);
    continuation.value = continuation.value.substr(
        std::min(output_config.max_bytes_per_line, continuation.value.size()));
    return;
  }

  size_t size_of = 0;
  {
    std::stringstream ss;
    ss << std::setw(static_cast<int>(output_config.largest_type_string))
       << std::left;
    ss << GenerateTypeString(region);
    os << ss.str();
    size_of = ss.str().size();
  }
  os << " " << output_config.delimiter << " ";
  if (region.array_length) {
    // Record where the value is first being outputted.
    continuation.value_start_column = 3 + size_of;

    // Get the full-length value, which we will chunk below.
    const std::string value = ToValueString(region, binary, output_config);

    std::stringstream ss;
    ss << std::setw(static_cast<int>(output_config.largest_value_string))
       << std::left;
    ss << value.substr(0, output_config.max_bytes_per_line);
    os << ss.str();

    continuation.value =
        value.substr(std::min(output_config.max_bytes_per_line, value.size()));
  } else {
    std::stringstream ss;
    ss << std::setw(static_cast<int>(output_config.largest_value_string))
       << std::left;
    ss << ToValueString(region, binary, output_config);
    os << ss.str();
  }

  os << " " << output_config.delimiter << " ";
  os << GenerateComment(region.comment, section);
}